

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void __thiscall
duckdb::ReservoirQuantileState<int>::FillReservoir
          (ReservoirQuantileState<int> *this,idx_t sample_size,int element)

{
  idx_t iVar1;
  int in_EDX;
  ulong in_RSI;
  ReservoirQuantileState<int> *in_RDI;
  int *in_stack_ffffffffffffffd8;
  
  if (in_RDI->pos < in_RSI) {
    iVar1 = in_RDI->pos;
    in_RDI->pos = iVar1 + 1;
    in_RDI->v[iVar1] = in_EDX;
    duckdb::BaseReservoirSampling::InitializeReservoirWeights((ulong)in_RDI->r_samp,in_RDI->pos);
  }
  else if (*(long *)(in_RDI->r_samp + 0x30) == *(long *)(in_RDI->r_samp + 0x48)) {
    ReplaceElement(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}